

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O2

void __thiscall
RuntimeObjectSystem::SetupObjectConstructors
          (RuntimeObjectSystem *this,IPerModuleInterface *pPerModuleInterface)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  AUDynArray<IObjectConstructor_*> constructors;
  IAUDynArray<IObjectConstructor_*> local_30;
  long *plVar4;
  
  (*pPerModuleInterface->_vptr_IPerModuleInterface[2])(pPerModuleInterface,this->m_pSystemTable);
  (*pPerModuleInterface->_vptr_IPerModuleInterface[3])(pPerModuleInterface,this);
  iVar3 = (**pPerModuleInterface->_vptr_IPerModuleInterface)(pPerModuleInterface);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  AUDynArray<IObjectConstructor_*>::AUDynArray
            ((AUDynArray<IObjectConstructor_*> *)&local_30,plVar4[1] - *plVar4 >> 3);
  lVar1 = plVar4[1];
  lVar2 = *plVar4;
  for (lVar5 = 0; lVar1 - lVar2 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    local_30.m_vec.super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar5] = *(IObjectConstructor **)(*plVar4 + lVar5 * 8);
  }
  if (this->m_bAutoCompile != false) {
    SetupRuntimeFileTracking(this,&local_30);
  }
  (*this->m_pObjectFactorySystem->_vptr_IObjectFactorySystem[3])
            (this->m_pObjectFactorySystem,&local_30);
  AUDynArray<IObjectConstructor_*>::~AUDynArray((AUDynArray<IObjectConstructor_*> *)&local_30);
  return;
}

Assistant:

void RuntimeObjectSystem::SetupObjectConstructors(IPerModuleInterface* pPerModuleInterface)
{
    // Set system Table
    pPerModuleInterface->SetSystemTable( m_pSystemTable );
    pPerModuleInterface->SetRuntimeObjectSystem( this );

	// get hold of the constructors
	const std::vector<IObjectConstructor*> &objectConstructors = pPerModuleInterface->GetConstructors();
	AUDynArray<IObjectConstructor*> constructors(objectConstructors.size());
	for (size_t i = 0, iMax = objectConstructors.size(); i < iMax; ++i)
	{
		constructors[i] = objectConstructors[i];
	}

	if (m_bAutoCompile)
	{
		SetupRuntimeFileTracking(constructors);
	}

	m_pObjectFactorySystem->AddConstructors(constructors);

}